

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pob-3119-rb.c
# Opt level: O2

int pob_recv_pkt(int sock,rtp_pkt_t *pkt)

{
  uint __i;
  int iVar1;
  int iVar2;
  long lVar3;
  int *piVar4;
  ulong uVar5;
  timeval t_out;
  fd_set fds;
  
  t_out.tv_sec = 0;
  t_out.tv_usec = 20000;
  for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
    fds.__fds_bits[lVar3] = 0;
  }
  uVar5 = 1L << ((byte)sock & 0x3f);
  fds.__fds_bits[sock / 0x40] = fds.__fds_bits[sock / 0x40] | uVar5;
  iVar2 = 0;
  iVar1 = select(sock + 1,(fd_set *)&fds,(fd_set *)0x0,(fd_set *)0x0,(timeval *)&t_out);
  if (iVar1 == -1) {
    piVar4 = __errno_location();
    if ((*piVar4 != 4) && (*piVar4 != 0xb)) {
      perror("select");
      iVar2 = -1;
    }
  }
  else {
    iVar2 = 0;
    if ((fds.__fds_bits[sock / 0x40] & uVar5) != 0) {
      rtp_rfc3119_pkt_init(pkt);
      iVar2 = rtp_pkt_read(pkt,sock);
      iVar2 = (uint)(0 < iVar2) * 2 + -1;
    }
  }
  return iVar2;
}

Assistant:

int pob_recv_pkt(int sock, rtp_pkt_t *pkt) {
  struct timeval t_out;
  t_out.tv_sec  = 0;
  t_out.tv_usec = RTP_MINSLEEP;

  fd_set fds;
  FD_ZERO(&fds);
  FD_SET(sock, &fds);

  /*M
    Wait for network input or for timeout.
  **/
  int ret = select(sock + 1, &fds, NULL, NULL, &t_out);
  
  /*M
    Check for interrupted system call.
  **/
  if (ret == -1) {
    if ((errno == EINTR) || (errno == EAGAIN)) {
      return 0;
    } else {
      perror("select");
      return -1;
    }
  }
  
  /*M
    If there is network input, read incoming packet.
  **/
  if (FD_ISSET(sock, &fds)) {
    rtp_rfc3119_pkt_init(pkt);
    
    if (rtp_pkt_read(pkt, sock) <= 0) {
      return -1;
    } else {
      return 1;
    }
  }

  return 0;
}